

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::set_main_font(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                *this,shared_ptr<dlib::font> *f)

{
  scrollable_region *this_00;
  element_type *peVar1;
  base_window *in_RSI;
  unsigned_long *in_RDI;
  unsigned_long i;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffff68;
  auto_mutex *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffffc0;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffc8;
  scrollable_region *inc;
  scrollable_region *this_01;
  rectangle *in_stack_ffffffffffffffe8;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::shared_ptr<dlib::font>::operator=
            ((shared_ptr<dlib::font> *)in_stack_ffffffffffffff70,
             (shared_ptr<dlib::font> *)in_stack_ffffffffffffff68);
  inc = (scrollable_region *)0x0;
  while( true ) {
    this_01 = inc;
    this_00 = (scrollable_region *)
              array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ::size((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 0x24c));
    if (this_00 <= inc) break;
    std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x4526c4
              );
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)(in_RDI + 0x24c),(unsigned_long)this_01);
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)(in_RDI + 0x24c),(unsigned_long)this_01);
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)(in_RDI + 0x24c),(unsigned_long)this_01);
    font::compute_size<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
              ((font *)this_01,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI,
               (size_type)this_00,(size_type)inc);
    inc = (scrollable_region *)((long)&(this_01->super_drawable)._vptr_drawable + 1);
  }
  peVar1 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x4527a0);
  (*peVar1->_vptr_font[4])();
  scrollable_region::set_vertical_scroll_increment(this_00,(unsigned_long)inc);
  base_window::invalidate_rectangle(in_RSI,in_stack_ffffffffffffffe8);
  auto_mutex::~auto_mutex((auto_mutex *)0x4527e2);
  return;
}

Assistant:

void list_box<S>::
    set_main_font (
        const std::shared_ptr<font>& f
    )
    {
        auto_mutex M(m);
        mfont = f;
        // recompute the sizes of all the items
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            mfont->compute_size(items[i].name,items[i].width, items[i].height);
        }
        set_vertical_scroll_increment(mfont->height());
        parent.invalidate_rectangle(rect);
    }